

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
basic_json<std::unordered_multimap<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>,void>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,
          unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *val)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> j;
  allocator_type local_31;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
  local_30;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
  local_28;
  undefined2 local_20 [4];
  pointer local_18;
  
  local_28.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
             )(val->_M_h)._M_before_begin._M_nxt;
  local_30.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
             )(__node_type *)0x0;
  local_18 = create_object<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,bool>,false,true>&,std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,bool>,false,true>&>
                       ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)local_20,
                        &local_31,&local_28,&local_30);
  local_20[0] = 0xd;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_move
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_20);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_20);
  return;
}

Assistant:

basic_json(const T& val)
            : basic_json(json_type_traits<basic_json,T>::to_json(val))
        {
        }